

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

mbedtls_mpi_uint
mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  mbedtls_mpi_uint t;
  mbedtls_mpi_uint z;
  size_t i;
  mbedtls_mpi_uint c;
  size_t limbs_local;
  mbedtls_mpi_uint *B_local;
  mbedtls_mpi_uint *A_local;
  mbedtls_mpi_uint *X_local;
  
  i = 0;
  for (z = 0; z < limbs; z = z + 1) {
    uVar1 = A[z] - i;
    i = (long)(int)(uint)(uVar1 < B[z]) + (long)(int)(uint)(A[z] < i);
    X[z] = uVar1 - B[z];
  }
  return i;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_sub(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint z = (A[i] < c);
        mbedtls_mpi_uint t = A[i] - c;
        c = (t < B[i]) + z;
        X[i] = t - B[i];
    }

    return c;
}